

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  void *pvVar3;
  int iVar4;
  uchar tmp [64];
  uchar auStack_68 [72];
  
  iVar4 = -0x5100;
  if (ctx != (mbedtls_md_context_t *)0x0) {
    pmVar2 = ctx->md_info;
    iVar4 = -0x5100;
    if ((pmVar2 != (mbedtls_md_info_t *)0x0) && (pvVar3 = ctx->hmac_ctx, pvVar3 != (void *)0x0)) {
      iVar1 = pmVar2->block_size;
      iVar4 = (*pmVar2->finish_func)(ctx->md_ctx,auStack_68);
      if ((iVar4 == 0) &&
         (((iVar4 = (*ctx->md_info->starts_func)(ctx->md_ctx), iVar4 == 0 &&
           (iVar4 = (*ctx->md_info->update_func)
                              (ctx->md_ctx,(uchar *)((long)pvVar3 + (long)iVar1),
                               (long)ctx->md_info->block_size), iVar4 == 0)) &&
          (iVar4 = (*ctx->md_info->update_func)(ctx->md_ctx,auStack_68,(long)ctx->md_info->size),
          iVar4 == 0)))) {
        iVar4 = (*ctx->md_info->finish_func)(ctx->md_ctx,output);
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_md_hmac_finish( mbedtls_md_context_t *ctx, unsigned char *output )
{
    int ret;
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    if( ( ret = ctx->md_info->finish_func( ctx->md_ctx, tmp ) ) != 0 )
        return( ret );
    if( ( ret = ctx->md_info->starts_func( ctx->md_ctx ) ) != 0 )
        return( ret );
    if( ( ret = ctx->md_info->update_func( ctx->md_ctx, opad,
                                           ctx->md_info->block_size ) ) != 0 )
        return( ret );
    if( ( ret = ctx->md_info->update_func( ctx->md_ctx, tmp,
                                           ctx->md_info->size ) ) != 0 )
        return( ret );
    return( ctx->md_info->finish_func( ctx->md_ctx, output ) );
}